

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O3

uint64 CityHash64WithSeed(char *s,size_t len,uint64 seed)

{
  uint64 uVar1;
  ulong uVar2;
  
  uVar1 = CityHash64(s,len);
  uVar2 = (uVar1 + 0x651e95c4d06fbfb1 ^ seed) * -0x622015f714c7d297;
  uVar2 = (uVar2 >> 0x2f ^ seed ^ uVar2) * -0x622015f714c7d297;
  return (uVar2 ^ uVar2 >> 0x2f) * -0x622015f714c7d297;
}

Assistant:

uint64 CityHash64WithSeed(const char *s, size_t len, uint64 seed) {
  return CityHash64WithSeeds(s, len, k2, seed);
}